

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O3

ON_RTreeBBox * NodeCover(ON_RTreeBBox *__return_storage_ptr__,ON_RTreeNode *a_node)

{
  double *pdVar1;
  double dVar2;
  uint uVar3;
  ON_RTreeBBox *pOVar4;
  ON_RTreeBranch *pOVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  uVar3 = a_node->m_count;
  if (0 < (int)uVar3) {
    pOVar4 = (ON_RTreeBBox *)(ulong)(uVar3 - 1);
    dVar8 = a_node->m_branch[(long)pOVar4].m_rect.m_min[0];
    dVar9 = a_node->m_branch[(long)pOVar4].m_rect.m_min[1];
    pdVar1 = a_node->m_branch[(long)pOVar4].m_rect.m_min + 2;
    dVar10 = *pdVar1;
    dVar11 = pdVar1[1];
    pdVar1 = a_node->m_branch[(long)pOVar4].m_rect.m_max + 1;
    dVar12 = pdVar1[1];
    __return_storage_ptr__->m_max[1] = *pdVar1;
    __return_storage_ptr__->m_max[2] = dVar12;
    __return_storage_ptr__->m_min[2] = dVar10;
    __return_storage_ptr__->m_max[0] = dVar11;
    __return_storage_ptr__->m_min[0] = dVar8;
    __return_storage_ptr__->m_min[1] = dVar9;
    if (uVar3 - 1 != 0) {
      pOVar5 = a_node->m_branch;
      uVar6 = SUB84(__return_storage_ptr__->m_min[0],0);
      uVar7 = (undefined4)((ulong)__return_storage_ptr__->m_min[0] >> 0x20);
      dVar8 = __return_storage_ptr__->m_min[1];
      dVar9 = __return_storage_ptr__->m_min[2];
      dVar10 = __return_storage_ptr__->m_max[0];
      dVar11 = __return_storage_ptr__->m_max[1];
      dVar12 = __return_storage_ptr__->m_max[2];
      do {
        dVar2 = (pOVar5->m_rect).m_min[0];
        if (dVar2 <= (double)CONCAT44(uVar7,uVar6) && (double)CONCAT44(uVar7,uVar6) != dVar2) {
          __return_storage_ptr__->m_min[0] = dVar2;
          uVar6 = SUB84(dVar2,0);
          uVar7 = (undefined4)((ulong)dVar2 >> 0x20);
        }
        dVar2 = (pOVar5->m_rect).m_min[1];
        if (dVar2 < dVar8) {
          __return_storage_ptr__->m_min[1] = dVar2;
          dVar8 = dVar2;
        }
        dVar2 = (pOVar5->m_rect).m_min[2];
        if (dVar2 < dVar9) {
          __return_storage_ptr__->m_min[2] = dVar2;
          dVar9 = dVar2;
        }
        dVar2 = (pOVar5->m_rect).m_max[0];
        if (dVar10 < dVar2) {
          __return_storage_ptr__->m_max[0] = dVar2;
          dVar10 = dVar2;
        }
        dVar2 = (pOVar5->m_rect).m_max[1];
        if (dVar11 < dVar2) {
          __return_storage_ptr__->m_max[1] = dVar2;
          dVar11 = dVar2;
        }
        dVar2 = (pOVar5->m_rect).m_max[2];
        if (dVar12 < dVar2) {
          __return_storage_ptr__->m_max[2] = dVar2;
          dVar12 = dVar2;
        }
        pOVar5 = pOVar5 + 1;
        uVar3 = (int)pOVar4 - 1;
        pOVar4 = (ON_RTreeBBox *)(ulong)uVar3;
      } while (uVar3 != 0);
    }
    return pOVar4;
  }
  __return_storage_ptr__->m_max[1] = 0.0;
  __return_storage_ptr__->m_max[2] = 0.0;
  __return_storage_ptr__->m_min[2] = 0.0;
  __return_storage_ptr__->m_max[0] = 0.0;
  __return_storage_ptr__->m_min[0] = 0.0;
  __return_storage_ptr__->m_min[1] = 0.0;
  return (ON_RTreeBBox *)(ulong)uVar3;
}

Assistant:

static ON_RTreeBBox NodeCover(ON_RTreeNode* a_node)
{
  int i;
  const ON_RTreeBranch* branch;
  ON_RTreeBBox rect;

  if ( (i = a_node->m_count) > 0 )
  {
    rect = a_node->m_branch[--i].m_rect;
    for ( branch = a_node->m_branch; i; i--, branch++ )
    {
#if (3 == ON_RTree_NODE_DIM)
      if ( rect.m_min[0] > branch->m_rect.m_min[0] )
        rect.m_min[0] = branch->m_rect.m_min[0];
      if ( rect.m_min[1] > branch->m_rect.m_min[1] )
        rect.m_min[1] = branch->m_rect.m_min[1];
      if ( rect.m_min[2] > branch->m_rect.m_min[2] )
        rect.m_min[2] = branch->m_rect.m_min[2];
      if ( rect.m_max[0] < branch->m_rect.m_max[0] )
        rect.m_max[0] = branch->m_rect.m_max[0];
      if ( rect.m_max[1] < branch->m_rect.m_max[1] )
        rect.m_max[1] = branch->m_rect.m_max[1];
      if ( rect.m_max[2] < branch->m_rect.m_max[2] )
        rect.m_max[2] = branch->m_rect.m_max[2];
#else
      for( int j = 0; j < ON_RTree_NODE_DIM; j++ )
      {
        if ( rect.m_min[j] > branch->m_rect.m_min[j] )
          rect.m_min[j] = branch->m_rect.m_min[j];
        if ( rect.m_max[j] < branch->m_rect.m_max[j] )
          rect.m_max[j] = branch->m_rect.m_max[j];
      }
#endif
    }
  }
  else
  {
    InitRect(&rect);
  }

  return rect;
}